

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int session_begin(SESSION_HANDLE session)

{
  int iVar1;
  int iVar2;
  SESSION_INSTANCE *session_instance;
  
  if (session != (SESSION_HANDLE)0x0) {
    iVar1 = connection_start_endpoint
                      (session->endpoint,on_frame_received,on_connection_state_changed,session);
    iVar2 = 0x36b;
    if ((iVar1 == 0) && (iVar2 = 0, (session->field_0x68 & 1) == 0)) {
      iVar1 = connection_open(session->connection);
      iVar2 = 0x374;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      session->field_0x68 = iVar1 == 0 | session->field_0x68 & 0xfe;
    }
    return iVar2;
  }
  return 0x363;
}

Assistant:

int session_begin(SESSION_HANDLE session)
{
    int result;

    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        if (connection_start_endpoint(session_instance->endpoint, on_frame_received, on_connection_state_changed, session_instance) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (!session_instance->is_underlying_connection_open)
            {
                if (connection_open(session_instance->connection) != 0)
                {
                    session_instance->is_underlying_connection_open = UNDERLYING_CONNECTION_NOT_OPEN;
                    result = MU_FAILURE;
                }
                else
                {
                    session_instance->is_underlying_connection_open = UNDERLYING_CONNECTION_OPEN;
                    result = 0;
                }
            }
            else
            {
                result = 0;
            }
        }
    }

    return result;
}